

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O2

void __thiscall capnp::SchemaParser::setDiskFilesystem(SchemaParser *this,Filesystem *fs)

{
  bool bVar1;
  Fault f;
  Locked<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_> lock;
  DebugComparison<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_&,_const_kj::None_&> _kjCondition;
  
  kj::MutexGuarded<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_>::lockExclusive
            ((MutexGuarded<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_> *)&lock,
             &((this->impl).ptr)->compat);
  bVar1 = ((lock.ptr)->ptr).isSet;
  _kjCondition.result = (bool)(bVar1 ^ 1);
  _kjCondition.left = lock.ptr;
  _kjCondition.right = (None *)&kj::none;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (bVar1 == false) {
    kj::_::NullableValue<capnp::SchemaParser::DiskFileCompat>::emplace<kj::Filesystem&>
              (&(lock.ptr)->ptr,fs);
    kj::Locked<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_>::~Locked(&lock);
    return;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<capnp::SchemaParser::DiskFileCompat>&,kj::None_const&>&,char_const(&)[54]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-parser.c++"
             ,0x11c,FAILED,"*lock == kj::none",
             "_kjCondition,\"already called parseDiskFile() or setDiskFilesystem()\"",&_kjCondition,
             (char (*) [54])"already called parseDiskFile() or setDiskFilesystem()");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void SchemaParser::setDiskFilesystem(kj::Filesystem& fs) {
  auto lock = impl->compat.lockExclusive();
  KJ_REQUIRE(*lock == kj::none, "already called parseDiskFile() or setDiskFilesystem()");
  lock->emplace(fs);
}